

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O1

bool sptk::SetBinaryMode(void)

{
  return true;
}

Assistant:

bool SetBinaryMode() {
#ifdef _WIN32
  if (-1 == _setmode(_fileno(stdin), _O_BINARY) ||
      -1 == _setmode(_fileno(stdout), _O_BINARY)) {
    return false;
  }
#endif
  return true;
}